

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

shared_ptr<cxxopts::Value> __thiscall
cxxopts::values::
abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
implicit_value(abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,string *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cxxopts::Value> sVar1;
  
  value[1].field_2._M_local_buf[1] = '\x01';
  std::__cxx11::string::_M_assign((string *)(value[2].field_2._M_local_buf + 8));
  std::__shared_ptr<cxxopts::Value,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<cxxopts::Value,void>
            ((__shared_ptr<cxxopts::Value,(__gnu_cxx::_Lock_policy)2> *)this,
             (__weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2> *)&value->_M_string_length);
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Value;
  return (shared_ptr<cxxopts::Value>)
         sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value>
      implicit_value(const std::string& value)
      {
        m_implicit = true;
        m_implicit_value = value;
        return shared_from_this();
      }